

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> __thiscall
wabt::interp::EventType::Clone(EventType *this)

{
  _func_int **in_RAX;
  EventType *in_RSI;
  _func_int **local_18;
  
  local_18 = in_RAX;
  MakeUnique<wabt::interp::EventType,wabt::interp::EventType_const&>((wabt *)&local_18,in_RSI);
  (this->super_ExternType)._vptr_ExternType = local_18;
  return (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExternType> EventType::Clone() const {
  return MakeUnique<EventType>(*this);
}